

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.c
# Opt level: O2

void test_encode(void)

{
  uint8_t *in;
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char acVar4 [8];
  uint uVar5;
  ulong uVar6;
  char local_448 [8];
  char buf [1024];
  char local_40 [8];
  char name [8];
  
  acVar4[0] = '\b';
  acVar4[1] = '}';
  acVar4[2] = '\x10';
  acVar4[3] = '\0';
  acVar4[4] = '\0';
  acVar4[5] = '\0';
  acVar4[6] = '\0';
  acVar4[7] = '\0';
  for (uVar6 = 0; uVar6 != 7; uVar6 = uVar6 + 1) {
    snprintf(local_40,8,"%d",uVar6 & 0xffffffff);
    acutest_case_("%s",local_40);
    in = *(uint8_t **)((long)acVar4 + -8);
    __s = *(char **)acVar4;
    sVar2 = strlen((char *)in);
    sVar3 = nni_base64_encode(in,sVar2,local_448,0x400);
    uVar5 = (uint)sVar3;
    name = acVar4;
    acutest_check_(~uVar5 >> 0x1f,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x31,"%s","rv >= 0");
    sVar2 = strlen(__s);
    acutest_check_((uint)(uVar5 == (uint)sVar2),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x32,"%s","rv == (int) strlen(cases[i].encoded)");
    local_448[(int)uVar5] = '\0';
    iVar1 = strcmp(local_448,__s);
    acVar4 = name;
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x34,"%s","strcmp(buf, cases[i].encoded) == 0");
    acVar4 = (char  [8])((long)acVar4 + 0x10);
  }
  return;
}

Assistant:

void
test_encode(void)
{
	int   i;
	void *dec;

	for (i = 0; (dec = cases[i].decoded) != NULL; i++) {
		char buf[1024];
		char name[8];
		int  rv;

		(void) snprintf(name, sizeof(name), "%d", i);
		TEST_CASE(name);
		rv = (int) nni_base64_encode(dec, strlen(dec), buf, 1024);
		TEST_CHECK(rv >= 0);
		TEST_CHECK(rv == (int) strlen(cases[i].encoded));
		buf[rv] = 0;
		TEST_CHECK(strcmp(buf, cases[i].encoded) == 0);
	}
}